

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_k_tf.c
# Opt level: O0

void lda_k_tf_init(xc_func_type *p)

{
  void *pvVar1;
  undefined8 *in_RDI;
  lda_k_tf_params *params;
  
  pvVar1 = malloc(8);
  in_RDI[0x2f] = pvVar1;
  if (*(int *)*in_RDI == 0x32) {
    *(undefined8 *)in_RDI[0x2f] = 0x3ff1ade0a4f67432;
  }
  else {
    if (*(int *)*in_RDI != 0x33) {
      fprintf(_stderr,"Internal error in lda_k_tf\n");
      exit(1);
    }
    *(undefined8 *)in_RDI[0x2f] = 0x3ff247624737528c;
  }
  return;
}

Assistant:

static void
lda_k_tf_init(xc_func_type *p)
{
  lda_k_tf_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_k_tf_params));
  params = (lda_k_tf_params *) (p->params);

  switch(p->info->number){
  case XC_LDA_K_TF:
    /* 3/10*(3*M_PI^2)^(2/3) * (3/4 pi)^(2/3) = 3/10*pow(9*M_PI/4, 2/3) */
    params->ax = 1.104950565705860002098832079519635692942;
    break;
  case XC_LDA_K_LP:
    /* 3*M_PI/2^(5/3) * (3/4 pi)^(2/3) = 3*M_PI*pow(3/(8*M_PI), 2/3)*/
    params->ax = 1.142427709758666675644309251677891925671;
    break;
  default:
    fprintf(stderr, "Internal error in lda_k_tf\n");
    exit(1);
  }
}